

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_debug_trace(lua_State *L,int opCode,int pc)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  char *__assertion;
  
  pTVar1 = L->ci->func;
  if (pTVar1->tt_ == 0x8006) {
    p_Var2 = (pTVar1->value_).f;
    if (p_Var2[8] == (_func_int_lua_State_ptr)0x6) {
      (L->ci->u).l.savedpc =
           (Instruction *)(*(long *)(*(long *)(p_Var2 + 0x18) + 0x38) + 4 + (long)pc * 4);
      if ((L->hookmask & 0xc) != 0) {
        luaG_traceexec(L);
        return;
      }
      return;
    }
    __assertion = "(((L->ci->func)->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    __assertion = "((((L->ci->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0xadf,"void raviV_debug_trace(lua_State *, int, int)");
}

Assistant:

void raviV_debug_trace(lua_State *L, int opCode, int pc) {
  //  RAVI_DEBUG_STACK(
  //      char buf[100]; CallInfo *ci = L->ci;
  //      int funcpos = (int)(ci->func - L->stack);
  //      int top = (int)(L->top - L->stack);
  //      int ci_top = (int)(ci->top - L->stack);
  //      int base = (int)(ci->u.l.base - L->stack); raviP_instruction_to_str(
  //          buf, sizeof buf, clvalue(L->ci->func)->l.p->code[pc]);
  //      printf(
  //          "Stack dump %s (%s) function %d, pc=%d, L->top = %d, ci->top = %d\n",
  //          luaP_opnames[opCode], buf, funcpos, pc, (top - base),
  //          (ci_top - base));
  //      lua_assert(L->ci->u.l.base <= L->top &&
  //                 L->top < L->stack + L->stacksize);)

  // Updates the savedpc pointer in the call frame
  // The savedpc is unimportant for the JIT but it is relied upon
  // by the debug interface. So we need to set this in order for the
  // debug api to work. Rather than setting it on every bytecode instruction
  // we have a dual approach. By default the JIT code only sets this prior to
  // function calls - this enables better stack traces for example, and ad-hoc
  // calls to debug api.
  // See void RaviCodeGenerator::emit_update_savedpc(RaviFunctionDef * def,
  // int pc) which is used for this purpose.
  // An optional setting in the JIT compiler also
  // enables this to be updated per bytecode instruction - this is only
  // required if someone wishes to set a line hook. The second option
  // is very expensive and will inhibit optimizations, hence it is optional.
  // This is the setting that is done below - and then the hook is invoked
  // See issue #15
  LClosure *closure = clLvalue(L->ci->func);
  L->ci->u.l.savedpc = &closure->p->code[pc + 1];
  if (L->hookmask & (LUA_MASKLINE | LUA_MASKCOUNT)) luaG_traceexec(L);
}